

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dog.c
# Opt level: O1

monst * makedog(void)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  monst *mtmp;
  obj *otmp;
  char *pcVar6;
  char *name;
  
  if (preferred_pet == 'n') {
    return (monst *)0x0;
  }
  iVar2 = pet_type();
  if (iVar2 == 0x12) {
    name = dogname;
  }
  else if (iVar2 < 0x6b) {
    if ((iVar2 == 0x16) || (iVar2 == 0x19)) {
      name = wolfname;
    }
    else if (iVar2 == 0x5a) {
      name = ratname;
    }
    else {
LAB_00172261:
      name = catname;
    }
  }
  else if (iVar2 == 0x6b) {
    name = horsename;
  }
  else if (iVar2 == 0x152) {
    name = crocname;
  }
  else {
    if (iVar2 != 0xef) goto LAB_00172261;
    name = monkeyname;
  }
  if (*name == '\0') {
    if (iVar2 == 0x12) {
      if (urole.malenum == 0x15b) {
        name = "Slasher";
      }
      pcVar5 = "Hachi";
      if (urole.malenum != 0x165) {
        pcVar5 = name;
      }
      pcVar6 = "Idefix";
      if (urole.malenum != 0x15a) {
        pcVar6 = pcVar5;
      }
      name = "Sirius";
      if (urole.malenum != 0x163) {
        name = pcVar6;
      }
    }
    else {
      pcVar5 = "Nicodemus";
      if (urole.malenum != 0x15d) {
        pcVar5 = name;
      }
      if (iVar2 == 0x5a) {
        name = pcVar5;
      }
    }
  }
  mtmp = makemon(mons + iVar2,level,(int)u.ux,(int)u.uy,4);
  if (iVar2 < 0x6b) {
    if ((iVar2 != 0x16) && (iVar2 != 0x19)) goto LAB_001723d9;
LAB_0017234c:
    mtmp->m_lev = '\x01';
    uVar4 = mt_random();
    iVar3 = (uVar4 & 7) + 1;
    mtmp->mhp = iVar3;
    mtmp->mhpmax = iVar3;
    if (iVar2 != 0x6b) goto LAB_001723d9;
  }
  else if (iVar2 != 0x6b) {
    if ((iVar2 != 0x152) && (iVar2 != 0xef)) goto LAB_001723d9;
    goto LAB_0017234c;
  }
  otmp = mksobj(level,0xf0,'\x01','\0');
  if (otmp != (obj *)0x0) {
    iVar3 = mpickobj(mtmp,otmp);
    if (iVar3 != 0) {
      panic("merged saddle?");
    }
    pbVar1 = (byte *)((long)&mtmp->misc_worn_check + 2);
    *pbVar1 = *pbVar1 | 0x10;
    otmp->field_0x4a = otmp->field_0x4a | 0xe0;
    otmp->owornmask = 0x100000;
    otmp->corpsenm = mtmp->m_id;
    update_mon_intrinsics(level,mtmp,otmp,'\x01','\x01');
  }
LAB_001723d9:
  if ((((iVar2 == 0x22) && (*name == '\0')) &&
      (uVar4 = mt_random(), (uVar4 * -0x3d70a3d7 >> 2 | uVar4 * 0x40000000) < 0x28f5c29)) &&
     (name = "Shiva", (mtmp->field_0x60 & 1) == 0)) {
    name = "Kali";
  }
  if (*name != '\0') {
    mtmp = christen_monst(mtmp,name);
  }
  initedog(mtmp);
  return mtmp;
}

Assistant:

struct monst *makedog(void)
{
	struct monst *mtmp;
	struct obj *otmp;
	const char *petname;
	int   pettype;

	if (preferred_pet == 'n') return NULL;

	pettype = pet_type();
	if (pettype == PM_LITTLE_DOG)
		petname = dogname;
	else if (pettype == PM_PONY)
		petname = horsename;
	else if (pettype == PM_MONKEY)
		petname = monkeyname;
	else if (pettype == PM_WOLF || pettype == PM_WINTER_WOLF_CUB)
		petname = wolfname;
	else if (pettype == PM_BABY_CROCODILE)
		petname = crocname;
	else if (pettype == PM_SEWER_RAT)
		petname = ratname;
	else
		petname = catname;

	/* default pet names */
	if (!*petname) {
	    if (pettype == PM_LITTLE_DOG) {
		/* All of these names were for dogs. */
		if (Role_if(PM_CAVEMAN)) petname = "Slasher";   /* The Warrior */
		if (Role_if(PM_SAMURAI)) petname = "Hachi";     /* Shibuya Station */
		if (Role_if(PM_BARBARIAN)) petname = "Idefix";  /* Obelix */
		if (Role_if(PM_RANGER)) petname = "Sirius";     /* Orion's dog */
	    } else if (pettype == PM_SEWER_RAT) {
		if (Role_if(PM_CONVICT)) petname = "Nicodemus"; /* Rats of NIMH */
	    }
	}

	mtmp = makemon(&mons[pettype], level, u.ux, u.uy, MM_EDOG);

	/* Keep the exotic pets from being higher-level than normal starting
	 * pets.  (makedog is only called once, during game setup, so this
	 * is the place to put it.) */
	if (pettype == PM_WOLF ||
	    pettype == PM_WINTER_WOLF_CUB ||
	    pettype == PM_MONKEY ||
	    pettype == PM_BABY_CROCODILE) {
	    mtmp->m_lev  = 1;
	    mtmp->mhpmax = mtmp->mhp = dice(1,8);
	}

	/* Horses already wear a saddle */
	if (pettype == PM_PONY && !!(otmp = mksobj(level, SADDLE, TRUE, FALSE))) {
	    if (mpickobj(mtmp, otmp))
		panic("merged saddle?");
	    mtmp->misc_worn_check |= W_SADDLE;
	    otmp->dknown = otmp->bknown = otmp->rknown = 1;
	    otmp->owornmask = W_SADDLE;
	    otmp->leashmon = mtmp->m_id;
	    update_mon_intrinsics(level, mtmp, otmp, TRUE, TRUE);
	}

	if (!*petname && pettype == PM_KITTEN && !rn2(100)) {
	    if (mtmp->female) petname = "Shiva"; /* PM: RIP 1 Oct 1998 -  6 Sep 2009 */
	    else petname = "Kali";		 /* PM: RIP 1 May 2000 - 22 Oct 2012 */
	}

	if (*petname)
		mtmp = christen_monst(mtmp, petname);

	initedog(mtmp);
	return mtmp;
}